

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O1

void __thiscall
TPZSkylMatrix<std::complex<double>_>::SolveSOR
          (TPZSkylMatrix<std::complex<double>_> *this,int64_t *numiterations,
          TPZFMatrix<std::complex<double>_> *F,TPZFMatrix<std::complex<double>_> *result,
          TPZFMatrix<std::complex<double>_> *residual,TPZFMatrix<std::complex<double>_> *scratch,
          REAL overrelax,REAL *tol,int FromCurrent,int direction)

{
  double *pdVar1;
  complex<double> **ppcVar2;
  complex<double> *pcVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double dVar8;
  int iVar9;
  undefined4 extraout_var;
  undefined1 (*pauVar10) [16];
  TPZFMatrix<std::complex<double>_> *this_00;
  complex<double> *pcVar11;
  long lVar12;
  double *pdVar13;
  complex<double> *pcVar14;
  long lVar15;
  long lVar16;
  complex<double> *__z;
  long lVar17;
  REAL RVar18;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar19;
  double dVar20;
  double dVar21;
  undefined8 uVar22;
  complex<double> over;
  double local_128;
  double dStack_120;
  TPZFMatrix<std::complex<double>_> *local_118;
  TPZSkylMatrix<std::complex<double>_> *local_110;
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  long local_e8;
  REAL local_e0;
  double local_d8;
  double local_d0;
  long local_c8;
  int local_bc;
  long local_b8;
  double *local_b0;
  TPZFMatrix<std::complex<double>_> *local_a8;
  long *local_a0;
  complex<double> *local_98;
  long local_88;
  REAL local_80;
  long local_78;
  TPZFMatrix<std::complex<double>_> *local_70;
  long local_68;
  long local_60;
  REAL local_58;
  double dStack_50;
  double local_48;
  undefined8 uStack_40;
  
  local_108._8_8_ = local_108._0_8_;
  local_110 = this;
  local_a8 = F;
  local_a0 = numiterations;
  if (residual == F) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "TPZMatrix::SolveSOR called with residual and F equal, no solution\n",0x42);
    return;
  }
  local_bc = direction;
  local_b0 = tol;
  local_118 = scratch;
  local_e0 = overrelax;
  local_70 = residual;
  if (residual == (TPZFMatrix<std::complex<double>_> *)0x0) {
    local_108._0_8_ = *tol + *tol + 1.0;
  }
  else {
    Dot<std::complex<double>>(residual,residual);
    if ((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) < 0.0) {
      local_108._0_8_ = sqrt((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
    }
    else {
      local_108._0_8_ = SQRT((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
    }
  }
  if (FromCurrent == 0) {
    (*(result->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable[0xf])(result);
  }
  local_58 = local_e0;
  dStack_50 = 0.0;
  iVar9 = (*(local_110->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable
            ._vptr_TPZSavable[0xc])();
  lVar15 = 0;
  local_c8 = CONCAT44(extraout_var,iVar9) + -1;
  local_e8 = lVar15;
  if (local_bc != -1) {
    local_c8 = lVar15;
    local_e8 = CONCAT44(extraout_var,iVar9);
  }
  dVar21 = (double)local_108._0_8_;
  if ((0 < *local_a0) &&
     (*local_b0 <= (double)local_108._0_8_ && (double)local_108._0_8_ != *local_b0)) {
    local_80 = (REAL)(local_a8->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol;
    local_b8 = (ulong)(local_bc != -1) * 2 + -1;
    local_68 = local_c8 * 0x10 + 0x10;
    local_60 = local_b8 * 0x10;
    lVar15 = 0;
    this_00 = local_118;
    do {
      local_88 = lVar15;
      TPZFMatrix<std::complex<double>_>::operator=(this_00,local_a8);
      local_d0 = 0.0;
      this_00 = local_118;
      if (0 < (long)local_80) {
        local_d0 = 0.0;
        local_78 = 0;
        RVar18 = 0.0;
        do {
          local_e0 = RVar18;
          if (local_bc == 1) {
            local_108._0_8_ = local_68;
            lVar15 = local_c8;
            if (local_c8 != local_e8) {
              do {
                ppcVar2 = (local_110->fElem).fStore;
                lVar12 = (long)ppcVar2[lVar15 + 1] - (long)ppcVar2[lVar15];
                local_d8 = (double)(lVar12 >> 4);
                local_f8 = ZEXT816(0);
                pcVar3 = (local_110->fElem).fStore[lVar15];
                if (((lVar15 - (long)local_d8 < -1) ||
                    ((this_00->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow <=
                     (lVar15 - (long)local_d8) + 1)) ||
                   ((this_00->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol <=
                    (long)local_e0)) {
                  TPZFMatrix<std::complex<double>_>::Error
                            ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                if (((lVar15 < 0) ||
                    ((result->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow <=
                     lVar15)) ||
                   ((result->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol <=
                    (long)local_e0)) {
                  local_98 = pcVar3;
                  TPZFMatrix<std::complex<double>_>::Error
                            ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                local_f8 = *(undefined1 (*) [16])
                            result->fElem
                            [(result->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.
                             fRow * (long)local_e0 + lVar15]._M_value;
                pdVar13 = (double *)((long)(local_110->fElem).fStore[lVar15] + lVar12 + -0x10);
                lVar12 = (long)pdVar13 - (long)pcVar3 >> 4;
                if (-1 < lVar12) {
                  lVar12 = lVar12 + 1;
                  pauVar10 = (undefined1 (*) [16])
                             (this_00->fElem[-(long)local_d8]._M_value +
                             (this_00->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.
                             fRow * local_78 + local_108._0_8_);
                  do {
                    local_128 = *pdVar13;
                    dStack_120 = pdVar13[1];
                    std::complex<double>::operator*=
                              ((complex<double> *)&local_128,(complex<double> *)local_f8);
                    dVar21 = *(double *)(*pauVar10 + 8) - dStack_120;
                    auVar4._8_4_ = SUB84(dVar21,0);
                    auVar4._0_8_ = *(double *)*pauVar10 - local_128;
                    auVar4._12_4_ = (int)((ulong)dVar21 >> 0x20);
                    *pauVar10 = auVar4;
                    pauVar10 = pauVar10 + 1;
                    pdVar13 = pdVar13 + -2;
                    lVar12 = lVar12 + -1;
                  } while (lVar12 != 0);
                }
                lVar15 = lVar15 + local_b8;
                local_108._0_8_ = local_108._0_8_ + local_60;
                this_00 = local_118;
              } while (lVar15 != local_e8);
            }
            lVar15 = local_c8;
            RVar18 = local_e0;
            if (local_c8 != local_e8) {
              do {
                ppcVar2 = (local_110->fElem).fStore;
                lVar12 = (long)ppcVar2[lVar15 + 1] - (long)ppcVar2[lVar15];
                if (((lVar15 < 0) ||
                    ((this_00->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow <=
                     lVar15)) ||
                   ((this_00->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol <=
                    (long)RVar18)) {
                  TPZFMatrix<std::complex<double>_>::Error
                            ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                local_108._0_8_ = lVar15 * 0x10;
                local_f8 = *(undefined1 (*) [16])
                            this_00->fElem
                            [(this_00->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.
                             fRow * (long)RVar18 + lVar15]._M_value;
                lVar16 = (lVar15 - (lVar12 >> 4)) + 1;
                if (((lVar15 - (lVar12 >> 4) < -1) ||
                    ((result->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow <=
                     lVar16)) ||
                   ((result->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol <=
                    (long)RVar18)) {
                  TPZFMatrix<std::complex<double>_>::Error
                            ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                pcVar3 = (local_110->fElem).fStore[lVar15];
                pcVar14 = (complex<double> *)((long)pcVar3 + lVar12 + -0x10);
                if (pcVar3 < pcVar14) {
                  __z = result->fElem +
                        (result->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow *
                        (long)RVar18 + lVar16;
                  do {
                    pcVar11 = pcVar14;
                    local_128 = *(double *)pcVar11->_M_value;
                    dStack_120 = *(double *)(pcVar11->_M_value + 8);
                    std::complex<double>::operator*=((complex<double> *)&local_128,__z);
                    dStack_120 = (double)local_f8._8_8_ - dStack_120;
                    local_f8._8_4_ = SUB84(dStack_120,0);
                    local_f8._0_8_ = (double)local_f8._0_8_ - local_128;
                    local_f8._12_4_ = (int)((ulong)dStack_120 >> 0x20);
                    pcVar14 = pcVar11 + -1;
                    __z = __z + 1;
                    RVar18 = local_e0;
                  } while (pcVar3 < pcVar14);
                }
                else {
                  pcVar11 = (complex<double> *)((long)pcVar3 + lVar12);
                }
                local_128 = (double)local_f8._0_8_;
                dStack_120 = (double)local_f8._8_8_;
                std::complex<double>::operator*=
                          ((complex<double> *)&local_128,(complex<double> *)local_f8);
                local_d8 = cabs(local_128);
                local_128 = (double)local_f8._0_8_;
                dStack_120 = (double)local_f8._8_8_;
                std::complex<double>::operator*=
                          ((complex<double> *)&local_128,(complex<double> *)&local_58);
                uVar22 = 0;
                dVar20 = dStack_120;
                dVar21 = (double)__divdc3(SUB84(local_128,0),dStack_120,
                                          *(undefined8 *)pcVar14->_M_value,
                                          *(undefined8 *)(pcVar11[-1]._M_value + 8));
                if (((lVar15 < 0) ||
                    ((result->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow <=
                     lVar15)) ||
                   ((result->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol <=
                    (long)RVar18)) {
                  local_98 = (complex<double> *)dVar21;
                  local_48 = dVar20;
                  uStack_40 = uVar22;
                  TPZFMatrix<std::complex<double>_>::Error
                            ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                local_d0 = local_d0 + local_d8;
                lVar12 = (result->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow *
                         (long)RVar18;
                pdVar13 = (double *)(result->fElem[lVar12]._M_value + local_108._0_8_);
                dVar8 = pdVar13[1];
                pdVar1 = (double *)(result->fElem[lVar12]._M_value + local_108._0_8_);
                *pdVar1 = dVar21 + *pdVar13;
                pdVar1[1] = dVar20 + dVar8;
                lVar15 = lVar15 + local_b8;
                this_00 = local_118;
              } while (lVar15 != local_e8);
            }
          }
          else {
            lVar15 = local_c8;
            if (local_c8 != local_e8) {
              do {
                ppcVar2 = (local_110->fElem).fStore;
                lVar12 = (long)ppcVar2[lVar15 + 1] - (long)ppcVar2[lVar15];
                if (((lVar15 < 0) ||
                    ((this_00->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow <=
                     lVar15)) ||
                   ((this_00->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol <=
                    (long)local_e0)) {
                  TPZFMatrix<std::complex<double>_>::Error
                            ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                lVar16 = lVar12 >> 4;
                local_d8 = (double)(lVar15 * 0x10);
                pcVar3 = this_00->fElem +
                         (this_00->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow
                         * (long)local_e0 + lVar15;
                dVar21 = *(double *)pcVar3->_M_value;
                dVar20 = *(double *)(pcVar3->_M_value + 8);
                lVar17 = (lVar15 - lVar16) + 1;
                if (((lVar15 - lVar16 < -1) ||
                    ((result->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow <=
                     lVar17)) ||
                   ((result->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol <=
                    (long)local_e0)) {
                  local_108 = *(undefined1 (*) [16])pcVar3->_M_value;
                  TPZFMatrix<std::complex<double>_>::Error
                            ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                pcVar3 = (local_110->fElem).fStore[lVar15];
                pcVar14 = (complex<double> *)((long)pcVar3 + lVar12 + -0x10);
                if (pcVar3 < pcVar14) {
                  pcVar11 = result->fElem +
                            (result->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.
                            fRow * (long)local_e0 + lVar17;
                  do {
                    local_108._8_4_ = SUB84(dVar20,0);
                    local_108._0_8_ = dVar21;
                    local_108._12_4_ = (int)((ulong)dVar20 >> 0x20);
                    local_128 = *(double *)pcVar14->_M_value;
                    dStack_120 = *(double *)(pcVar14->_M_value + 8);
                    std::complex<double>::operator*=((complex<double> *)&local_128,pcVar11);
                    dVar21 = (double)local_108._0_8_ - local_128;
                    dVar20 = (double)local_108._8_8_ - dStack_120;
                    pcVar14 = pcVar14 + -1;
                    pcVar11 = pcVar11 + 1;
                  } while (pcVar3 < pcVar14);
                }
                uVar19 = (undefined4)((ulong)dVar20 >> 0x20);
                if (((lVar15 < 0) ||
                    ((local_118->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow <=
                     lVar15)) ||
                   ((local_118->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol <=
                    (long)local_e0)) {
                  local_108._8_4_ = SUB84(dVar20,0);
                  local_108._0_8_ = dVar21;
                  local_108._12_4_ = uVar19;
                  TPZFMatrix<std::complex<double>_>::Error
                            ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                auVar5._8_4_ = SUB84(dVar20,0);
                auVar5._0_8_ = dVar21;
                auVar5._12_4_ = uVar19;
                *(undefined1 (*) [16])
                 (local_118->fElem
                  [(local_118->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow *
                   (long)local_e0]._M_value + (long)local_d8) = auVar5;
                lVar15 = lVar15 + local_b8;
                this_00 = local_118;
              } while (lVar15 != local_e8);
            }
            lVar15 = local_c8;
            RVar18 = local_e0;
            if (local_c8 != local_e8) {
              do {
                ppcVar2 = (local_110->fElem).fStore;
                pcVar3 = ppcVar2[lVar15];
                lVar12 = (long)ppcVar2[lVar15 + 1] - (long)pcVar3;
                local_108._0_8_ = lVar12;
                lVar12 = lVar12 >> 4;
                lVar16 = (lVar15 - lVar12) + 1;
                if (((lVar15 - lVar12 < -1) ||
                    ((this_00->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow <=
                     lVar16)) ||
                   ((this_00->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol <=
                    (long)local_e0)) {
                  TPZFMatrix<std::complex<double>_>::Error
                            ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                lVar12 = (this_00->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow;
                lVar17 = lVar12 * (long)local_e0;
                pcVar14 = this_00->fElem;
                local_98 = (complex<double> *)lVar16;
                if (((lVar15 < 0) || (lVar12 <= lVar15)) ||
                   ((this_00->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol <=
                    (long)local_e0)) {
                  TPZFMatrix<std::complex<double>_>::Error
                            ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                local_f8._0_8_ =
                     *(undefined8 *)
                      this_00->fElem
                      [(this_00->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow *
                       (long)local_e0 + lVar15]._M_value;
                local_f8._8_8_ =
                     *(undefined8 *)
                      (this_00->fElem
                       [(this_00->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow *
                        (long)local_e0 + lVar15]._M_value + 8);
                if (((lVar15 < 0) ||
                    ((result->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow <=
                     lVar15)) ||
                   ((result->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol <=
                    (long)local_e0)) {
                  TPZFMatrix<std::complex<double>_>::Error
                            ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                local_128 = *(double *)pcVar3->_M_value;
                dStack_120 = *(double *)(pcVar3->_M_value + 8);
                std::complex<double>::operator*=
                          ((complex<double> *)&local_128,
                           result->fElem +
                           (result->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow
                           * (long)local_e0 + lVar15);
                local_128 = (double)local_f8._0_8_ - local_128;
                dStack_120 = (double)local_f8._8_8_ - dStack_120;
                local_f8._8_4_ = SUB84(dStack_120,0);
                local_f8._0_8_ = local_128;
                local_f8._12_4_ = (int)((ulong)dStack_120 >> 0x20);
                dStack_120 = (double)local_f8._8_8_;
                std::complex<double>::operator*=
                          ((complex<double> *)&local_128,(complex<double> *)local_f8);
                local_d8 = cabs(local_128);
                RVar18 = local_e0;
                local_128 = local_58;
                dStack_120 = dStack_50;
                std::complex<double>::operator*=
                          ((complex<double> *)&local_128,(complex<double> *)local_f8);
                dVar21 = dStack_120;
                local_f8._0_8_ =
                     __divdc3(SUB84(local_128,0),dStack_120,*(undefined8 *)pcVar3->_M_value,
                              *(undefined8 *)(pcVar3->_M_value + 8));
                local_f8._8_8_ = dVar21;
                if (((lVar15 < 0) ||
                    ((result->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow <=
                     lVar15)) ||
                   ((result->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol <=
                    (long)RVar18)) {
                  TPZFMatrix<std::complex<double>_>::Error
                            ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                lVar12 = (result->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow *
                         (long)RVar18;
                pcVar11 = result->fElem + lVar12 + lVar15;
                dVar21 = *(double *)(pcVar11->_M_value + 8) + dVar21;
                auVar6._8_4_ = SUB84(dVar21,0);
                auVar6._0_8_ = *(double *)pcVar11->_M_value + (double)local_f8._0_8_;
                auVar6._12_4_ = (int)((ulong)dVar21 >> 0x20);
                *(undefined1 (*) [16])result->fElem[lVar12 + lVar15]._M_value = auVar6;
                if (((lVar15 < 0) ||
                    ((result->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow <=
                     lVar15)) ||
                   ((result->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol <=
                    (long)RVar18)) {
                  TPZFMatrix<std::complex<double>_>::Error
                            ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                local_f8 = *(undefined1 (*) [16])
                            result->fElem
                            [(result->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.
                             fRow * (long)RVar18 + lVar15]._M_value;
                pcVar11 = (complex<double> *)
                          ((local_110->fElem).fStore[lVar15][-1]._M_value + local_108._0_8_);
                if (pcVar3 < pcVar11) {
                  pcVar14 = pcVar14 + lVar17 + (long)local_98;
                  do {
                    local_128 = *(double *)pcVar11->_M_value;
                    dStack_120 = *(double *)(pcVar11->_M_value + 8);
                    std::complex<double>::operator*=
                              ((complex<double> *)&local_128,(complex<double> *)local_f8);
                    dVar21 = *(double *)(pcVar14->_M_value + 8) - dStack_120;
                    auVar7._8_4_ = SUB84(dVar21,0);
                    auVar7._0_8_ = *(double *)pcVar14->_M_value - local_128;
                    auVar7._12_4_ = (int)((ulong)dVar21 >> 0x20);
                    *(undefined1 (*) [16])pcVar14->_M_value = auVar7;
                    pcVar14 = pcVar14 + 1;
                    pcVar11 = pcVar11 + -1;
                  } while (pcVar3 < pcVar11);
                }
                local_d0 = local_d0 + local_d8;
                lVar15 = lVar15 + local_b8;
                this_00 = local_118;
                RVar18 = local_e0;
              } while (lVar15 != local_e8);
            }
          }
          RVar18 = (REAL)((long)RVar18 + 1);
          local_78 = local_78 + 0x10;
        } while (RVar18 != local_80);
      }
      if (local_d0 < 0.0) {
        dVar21 = sqrt(local_d0);
        this_00 = local_118;
      }
      else {
        dVar21 = SQRT(local_d0);
      }
      lVar15 = local_88 + 1;
    } while ((lVar15 < *local_a0) && (*local_b0 <= dVar21 && dVar21 != *local_b0));
  }
  local_108._0_8_ = dVar21;
  if (local_70 != (TPZFMatrix<std::complex<double>_> *)0x0) {
    (*(local_110->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable[0x28])(local_110,result,local_a8);
  }
  *local_a0 = lVar15;
  *local_b0 = (double)local_108._0_8_;
  return;
}

Assistant:

void TPZSkylMatrix<TVar>::SolveSOR(int64_t & numiterations,const TPZFMatrix<TVar> &F,
                                   TPZFMatrix<TVar> &result, TPZFMatrix<TVar> *residual, TPZFMatrix<TVar> &scratch,const REAL overrelax,
                                   REAL &tol,const int FromCurrent,const int direction)  {
	
	if(residual == &F) {
		cout << "TPZMatrix::SolveSOR called with residual and F equal, no solution\n";
		return;
	}
	REAL res = 2.*tol+1.;
	if(residual) res = Norm(*residual);
	if(!FromCurrent) {
		result.Zero();
	}
    TVar over = overrelax;
	int64_t r = this->Dim();
	int64_t c = F.Cols();
	int64_t i,ifirst = 0, ilast = r, iinc = 1;
	if(direction == -1) {
		ifirst = r-1;
		ilast = 0;
		iinc = -1;
	}
	int64_t it;
	for(it=0; it<numiterations && res > tol; it++) {
		res = 0.;
		scratch = F;
		for(int64_t ic=0; ic<c; ic++) {
			if(direction == 1) {
				//
				// compute the upper triangular part first and put into the scractch vector
				//
				for(i=ifirst; i!=ilast; i+= iinc) {
					//TPZColuna *mydiag = &fDiag[i];
					int64_t offset = Size(i);
					TVar val;
					TVar *diag;
					TVar *diaglast = fElem[i];
					TVar *scratchp = &scratch(i-offset+1,ic);
					val = result(i,ic);
					diag = fElem[i] + offset-1;
					int64_t lastid = diag-diaglast;
					int64_t id;
					for(id=0; id<=lastid; id++) *(scratchp+id) -= *(diag-id) * val;
					/* codeguard fix
					 while( diag >= diaglast ) *scratchp++ -= *diag-- * val;
					 */
				}
				//
				// perform the SOR operation
				//
				for(i=ifirst; i!=ilast; i+= iinc) {
					//TPZColuna *mydiag = &fDiag[i];
					int64_t offset = Size(i);
					TVar val = scratch(i,ic);
					TVar *p = &result(i-offset+1,ic);
					TVar *diag = fElem[i] + offset-1;
					TVar *diaglast = fElem[i];
					while( diag > diaglast ) val -= *diag-- * *p++;
					res += abs(val*val);
					result(i,ic) += val*over/ (*diag);
				}
			} else {
				//
				// the direction is upward
				//
				// put the lower triangular part of the multiplication into the scratch vector
				//
				for(i=ifirst; i!=ilast; i+= iinc) {
					//TPZColuna *mydiag = &fDiag[i];
					int64_t offset = Size(i);
					TVar val = scratch(i,ic);
					TVar *p = &result(i-offset+1,ic);
					TVar *diag = fElem[i] + offset-1;
					TVar *diaglast = fElem[i];
					while( diag > diaglast ) val -= *diag-- * *p++;
					//					res += val*val;
					scratch(i,ic) = val;
				}
				//
				// perform the SOR operation
				//
				for(i=ifirst; i!=ilast; i+= iinc) {
					//TPZColuna *mydiag = &fDiag[i];
					int64_t offset = Size(i);
					//	TVar val = scratch(i,ic);
					TVar *diag;
					TVar *diaglast = fElem[i];
					TVar *scratchp = &scratch(i-offset+1,ic);
					//val= result(i,ic);
					TVar val = scratch(i,ic);
					val -= *diaglast * result(i,ic);
					res += abs(val*val);
					val = over * val / *diaglast;
					result(i,ic) += val;
					val = result(i,ic);
					diag = fElem[i] + offset-1;
					while( diag > diaglast ) *scratchp++ -= *diag-- * val;
				}
			}
		}
		res = sqrt(res);
	}
	if(residual) {
		this->Residual(result,F,*residual);
	}
	numiterations = it;
	tol = res;
}